

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_export_public_key(psa_key_handle_t handle,uint8_t *data,size_t data_size,size_t *data_length)

{
  psa_key_slot_t *ppStack_30;
  psa_status_t status;
  psa_key_slot_t *slot;
  size_t *data_length_local;
  size_t data_size_local;
  uint8_t *data_local;
  psa_key_handle_t handle_local;
  
  *data_length = 0;
  slot = (psa_key_slot_t *)data_length;
  data_length_local = (size_t *)data_size;
  data_size_local = (size_t)data;
  data_local._2_2_ = handle;
  data_local._4_4_ = psa_get_key_from_slot(handle,&stack0xffffffffffffffd0,0,0);
  if (data_local._4_4_ == 0) {
    data_local._4_4_ =
         psa_internal_export_key
                   (ppStack_30,(uint8_t *)data_size_local,(size_t)data_length_local,(size_t *)slot,1
                   );
  }
  return data_local._4_4_;
}

Assistant:

psa_status_t psa_export_public_key( psa_key_handle_t handle,
                                    uint8_t *data,
                                    size_t data_size,
                                    size_t *data_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    /* Set the key to empty now, so that even when there are errors, we always
     * set data_length to a value between 0 and data_size. On error, setting
     * the key to empty is a good choice because an empty key representation is
     * unlikely to be accepted anywhere. */
    *data_length = 0;

    /* Exporting a public key doesn't require a usage flag. */
    status = psa_get_key_from_slot( handle, &slot, 0, 0 );
    if( status != PSA_SUCCESS )
        return( status );
    return( psa_internal_export_key( slot, data, data_size,
                                     data_length, 1 ) );
}